

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onEnterBreakStatementAstNode
          (CompilerAstWalker *this,BreakStatementAstNode *param_1)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  pointer ppVar6;
  element_type *this_00;
  shared_ptr<compiler::EmissionContext> *this_01;
  pair<unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_98;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_80;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
  local_70;
  undefined1 local_68 [8];
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  iterator find;
  size_t loopIndex;
  size_t breakIndex;
  string local_38;
  BreakStatementAstNode *local_18;
  BreakStatementAstNode *param_1_local;
  CompilerAstWalker *this_local;
  
  local_18 = param_1;
  param_1_local = (BreakStatementAstNode *)this;
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (&peVar2->loopStartIndices);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty",
             (allocator<char> *)((long)&breakIndex + 7));
  Error::assertWithPanic(!bVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&breakIndex + 7));
  this_01 = &this->ec;
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  loopIndex = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                        (&peVar2->byteCode);
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (&peVar3->loopStartIndices);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar2->loopStartIndices,sVar4 - 1);
  find.
  super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
             )*pvVar5;
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  vec.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ::find(&peVar2->breakStatementsForLoops,(key_type *)&find);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_68,
             (nullptr_t)0x0);
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ::end(&peVar2->breakStatementsForLoops);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                      *)&vec.
                         super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,&local_70);
  if (bVar1) {
    std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>>();
    std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
              ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_68,
               &local_80);
    std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
              (&local_80);
    peVar2 = std::
             __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->ec);
    std::
    make_pair<unsigned_long&,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>&>
              (&local_98,(unsigned_long *)&find,
               (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_68);
    std::
    unordered_map<unsigned_long,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
    ::
    insert<std::pair<unsigned_long,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
              ((unordered_map<unsigned_long,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
                *)&peVar2->breakStatementsForLoops,&local_98);
    std::
    pair<unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~pair(&local_98);
  }
  else {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false,_false>
                           *)&vec.
                              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
              ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_68,
               &ppVar6->second);
  }
  this_00 = std::
            __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_00,&loopIndex);
  emit(this,Jump);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_68);
  return;
}

Assistant:

void onEnterBreakStatementAstNode(BreakStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onEnterBreakStatementAstNode encountered break statement but loopStartIndices empty");

    std::size_t breakIndex = this->ec->byteCode.size();
    std::size_t loopIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find == this->ec->breakStatementsForLoops.end()) {
      vec = std::make_shared<std::vector<std::size_t>>();
      this->ec->breakStatementsForLoops.insert(std::make_pair(loopIndex, vec));
    } else {
      vec = find->second;
    }

    vec->push_back(breakIndex);

    this->emit(bytecode::ByteCodeInstruction::Jump);
  }